

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O1

Triangle * GetRandomTriangle(function<float_()> *value)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> n;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> uv;
  vector<int,_std::allocator<int>_> faceIndices;
  bool bVar9;
  float *pfVar10;
  TriangleMesh *this;
  Allocator alloc;
  Triangle *pTVar11;
  char *message;
  int iVar12;
  long lVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uVar17;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  Point3f v [3];
  Point3<float> local_124;
  AssertionResult gtest_ar;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> local_108;
  vector<int,_std::allocator<int>_> local_f0;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> triVec;
  void *local_b8;
  undefined8 uStack_b0;
  long local_a8;
  void *local_98;
  undefined8 uStack_90;
  long local_88;
  void *local_78;
  undefined8 uStack_70;
  long local_68;
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> local_58;
  int indices [3];
  int local_34;
  
  v[0].super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  v[0].super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  v[0].super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  v[1].super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  v[1].super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  v[1].super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  v[2].super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  v[2].super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  v[2].super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  lVar13 = 0;
  do {
    iVar12 = 0;
    do {
      if ((value->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      fVar14 = (*value->_M_invoker)((_Any_data *)value);
      pfVar10 = (float *)(v + lVar13);
      if ((iVar12 != 0) && (pfVar10 = &v[lVar13].super_Tuple3<pbrt::Point3,_float>.y, iVar12 != 1))
      {
        pfVar10 = &v[lVar13].super_Tuple3<pbrt::Point3,_float>.z;
      }
      *pfVar10 = fVar14;
      iVar12 = iVar12 + 1;
    } while (iVar12 != 3);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  fVar2 = v[1].super_Tuple3<pbrt::Point3,_float>.x - v[0].super_Tuple3<pbrt::Point3,_float>.x;
  fVar3 = v[1].super_Tuple3<pbrt::Point3,_float>.y - v[0].super_Tuple3<pbrt::Point3,_float>.y;
  fVar14 = v[1].super_Tuple3<pbrt::Point3,_float>.z - v[0].super_Tuple3<pbrt::Point3,_float>.z;
  fVar4 = v[2].super_Tuple3<pbrt::Point3,_float>.x - v[0].super_Tuple3<pbrt::Point3,_float>.x;
  fVar5 = v[2].super_Tuple3<pbrt::Point3,_float>.y - v[0].super_Tuple3<pbrt::Point3,_float>.y;
  fVar6 = v[2].super_Tuple3<pbrt::Point3,_float>.z - v[0].super_Tuple3<pbrt::Point3,_float>.z;
  auVar16 = vfmsub213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)fVar3),
                            ZEXT416((uint)(fVar14 * fVar5)));
  auVar8 = vfnmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar5)),ZEXT416((uint)fVar14),
                            ZEXT416((uint)fVar5));
  auVar15 = vfmsub213ss_fma(ZEXT416((uint)fVar14),ZEXT416((uint)fVar4),
                            ZEXT416((uint)(fVar2 * fVar6)));
  auVar7 = vfnmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)fVar2),ZEXT416((uint)(fVar2 * fVar6))
                           );
  fVar14 = auVar15._0_4_ + auVar7._0_4_;
  auVar15 = vfmsub213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar2),ZEXT416((uint)(fVar3 * fVar4))
                           );
  auVar7 = vfnmadd213ss_fma(ZEXT416((uint)fVar4),ZEXT416((uint)fVar3),ZEXT416((uint)(fVar3 * fVar4))
                           );
  auVar16 = ZEXT416((uint)(auVar16._0_4_ + auVar8._0_4_));
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar14)),auVar16,auVar16);
  auVar15 = ZEXT416((uint)(auVar15._0_4_ + auVar7._0_4_));
  auVar16 = vfmadd231ss_fma(auVar16,auVar15,auVar15);
  if (1e-20 <= auVar16._0_4_) {
    if ((GetRandomTriangle(std::function<float()>)::identity == '\0') &&
       (iVar12 = __cxa_guard_acquire(&GetRandomTriangle(std::function<float()>)::identity),
       iVar12 != 0)) {
      pbrt::Transform::Transform(&GetRandomTriangle::identity);
      __cxa_guard_release(&GetRandomTriangle(std::function<float()>)::identity);
    }
    indices[0] = 0;
    indices[1] = 1;
    indices[2] = 2;
    this = (TriangleMesh *)operator_new(0x40);
    std::vector<int,std::allocator<int>>::vector<int*,void>
              ((vector<int,std::allocator<int>> *)&local_f0,indices,&local_34,
               (allocator_type *)&triVec);
    uVar17 = 0x29ba40;
    std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>::
    vector<pbrt::Point3<float>*,void>
              ((vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>> *)&local_108,v,
               &local_124,(allocator_type *)&gtest_ar);
    local_58.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78 = (void *)0x0;
    uStack_70 = 0;
    local_68 = 0;
    local_98 = (void *)0x0;
    uStack_90 = 0;
    local_88 = 0;
    local_b8 = (void *)0x0;
    uStack_b0 = 0;
    local_a8 = 0;
    n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_98;
    n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_78;
    n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&local_b8;
    uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffea8.ptr_;
    uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)uVar17;
    uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffffeb0;
    uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = in_stack_fffffffffffffeb4;
    faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._4_4_ = v[0].super_Tuple3<pbrt::Point3,_float>.y;
    faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = v[0].super_Tuple3<pbrt::Point3,_float>.x;
    faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_4_ = v[0].super_Tuple3<pbrt::Point3,_float>.z;
    faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish._4_4_ = v[1].super_Tuple3<pbrt::Point3,_float>.x;
    faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = v[1].super_Tuple3<pbrt::Point3,_float>.y;
    faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = v[1].super_Tuple3<pbrt::Point3,_float>.z;
    pbrt::TriangleMesh::TriangleMesh
              (this,&GetRandomTriangle::identity,false,&local_f0,&local_108,&local_58,n,uv,
               faceIndices);
    if (local_b8 != (void *)0x0) {
      operator_delete(local_b8,local_a8 - (long)local_b8);
    }
    if (local_98 != (void *)0x0) {
      operator_delete(local_98,local_88 - (long)local_98);
    }
    if (local_78 != (void *)0x0) {
      operator_delete(local_78,local_68 - (long)local_78);
    }
    if (local_58.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_108.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.
                      super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_108.
                            super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.
                            super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::Triangle::CreateTriangles(&triVec,this,alloc);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&gtest_ar,"1","triVec.size()",(int *)&stack0xfffffffffffffeb0,
               (unsigned_long *)&stack0xfffffffffffffea8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&stack0xfffffffffffffea8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffeb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes_test.cpp"
                 ,0x94,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffeb0,(Message *)&stack0xfffffffffffffea8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffeb0);
      if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            triVec.nStored !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar9 = testing::internal::IsTrue(true), bVar9)) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)triVec.nStored
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)triVec.nStored + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar1 = ((triVec.ptr)->
            super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
            ).bits;
    triVec.nStored = 0;
    (*(triVec.alloc.memoryResource)->_vptr_memory_resource[3])
              (triVec.alloc.memoryResource,triVec.ptr,triVec.nAlloc << 3,8);
    pTVar11 = (Triangle *)0x0;
    if ((short)(uVar1 >> 0x30) == 4) {
      pTVar11 = (Triangle *)(uVar1 & 0xffffffffffff);
    }
  }
  else {
    pTVar11 = (Triangle *)0x0;
  }
  return pTVar11;
}

Assistant:

Triangle *GetRandomTriangle(std::function<Float()> value) {
    // Triangle vertices
    Point3f v[3];
    for (int j = 0; j < 3; ++j)
        for (int k = 0; k < 3; ++k)
            v[j][k] = value();

    if (LengthSquared(Cross(v[1] - v[0], v[2] - v[0])) < 1e-20)
        // Don't into trouble with ~degenerate triangles.
        return nullptr;

    // Create the corresponding Triangle.
    static Transform identity;
    int indices[3] = {0, 1, 2};
    // Leaks...
    TriangleMesh *mesh = new TriangleMesh(identity, false, {indices, indices + 3},
                                          {v, v + 3}, {}, {}, {}, {});
    pstd::vector<ShapeHandle> triVec = Triangle::CreateTriangles(mesh, Allocator());
    EXPECT_EQ(1, triVec.size());
    return triVec[0].CastOrNullptr<Triangle>();
}